

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetElementI(Var instance,Var index,ScriptContext *scriptContext)

{
  bool bVar1;
  ulong uVar2;
  Var pvVar3;
  double dVar4;
  PropertyRecordUsageCache *local_40;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *cacheOwner;
  ScriptContext *pSStack_28;
  uint32 uint32Index;
  ScriptContext *scriptContext_local;
  Var index_local;
  Var instance_local;
  
  pSStack_28 = scriptContext;
  scriptContext_local = (ScriptContext *)index;
  index_local = instance;
  index_local = (Var)BreakSpeculation(instance);
  bVar1 = TaggedInt::Is(scriptContext_local);
  if (bVar1) {
    instance_local = GetElementIIntIndex(index_local,scriptContext_local,pSStack_28);
  }
  else {
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
    if (bVar1) {
      cacheOwner._4_4_ = JavascriptConversion::ToUInt32(scriptContext_local,pSStack_28);
      uVar2 = (ulong)cacheOwner._4_4_;
      dVar4 = JavascriptNumber::GetValue(scriptContext_local);
      if ((((double)uVar2 == dVar4) && (!NAN((double)uVar2) && !NAN(dVar4))) &&
         (bVar1 = TaggedInt::IsOverflow(cacheOwner._4_4_), !bVar1)) {
        scriptContext_local = (ScriptContext *)TaggedInt::ToVarUnchecked(cacheOwner._4_4_);
        pvVar3 = GetElementIIntIndex(index_local,scriptContext_local,pSStack_28);
        return pvVar3;
      }
    }
    else {
      bVar1 = VarIs<Js::RecyclableObject>(index_local);
      if ((bVar1) &&
         (bVar1 = GetPropertyRecordUsageCache
                            (scriptContext_local,pSStack_28,&local_40,
                             (RecyclableObject **)&propertyRecordUsageCache), bVar1)) {
        pvVar3 = GetElementIWithCache<false>
                           (index_local,(RecyclableObject *)propertyRecordUsageCache,local_40,
                            pSStack_28,(PropertyCacheOperationInfo *)0x0);
        return pvVar3;
      }
    }
    instance_local = GetElementIHelper(index_local,scriptContext_local,index_local,pSStack_28);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::OP_GetElementI(Var instance, Var index, ScriptContext* scriptContext)
    {
#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
        instance = BreakSpeculation(instance);
#endif
        if (TaggedInt::Is(index))
        {
            return GetElementIIntIndex(instance, index, scriptContext);
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(index))
        {
            uint32 uint32Index = JavascriptConversion::ToUInt32(index, scriptContext);

            if ((double)uint32Index == JavascriptNumber::GetValue(index) && !TaggedInt::IsOverflow(uint32Index))
            {
                index = TaggedInt::ToVarUnchecked(uint32Index);
                return GetElementIIntIndex(instance, index, scriptContext);
            }
        }
        else if (VarIs<RecyclableObject>(instance))
        {
            RecyclableObject* cacheOwner;
            PropertyRecordUsageCache* propertyRecordUsageCache;
            if (GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
            {
                return GetElementIWithCache<false /* ReturnOperationInfo */>(instance, cacheOwner, propertyRecordUsageCache, scriptContext, nullptr);
            }
        }

        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }